

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

void XPMP2::RmtSendMain(void)

{
  ulong uVar1;
  bool bVar2;
  SOCKET SVar3;
  int iVar4;
  SOCKET SVar5;
  SOCKET SVar6;
  XPMP2Error *this;
  undefined8 uVar7;
  int *piVar8;
  allocator<char> *__a;
  SOCKET *s_1;
  SOCKET *__end3_1;
  SOCKET *__begin3_1;
  SOCKET (*__range3_1) [2];
  exception *e;
  SOCKET *s;
  SOCKET *__end3;
  SOCKET *__begin3;
  SOCKET (*__range3) [2];
  string from;
  int retval;
  fd_set *__arr;
  uint __i;
  fd_set sRead;
  int maxSock;
  int cntMCErr;
  bool *in_stack_00000360;
  SockAddrTy *in_stack_00000368;
  string *in_stack_00000370;
  undefined1 in_stack_0000037f;
  UDPMulticast *in_stack_00000380;
  size_t in_stack_00000388;
  int in_stack_00000394;
  string *in_stack_00000398;
  int in_stack_000003a4;
  string *in_stack_000003a8;
  UDPMulticast *in_stack_000003b0;
  uint in_stack_000003c0;
  allocator<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  char *__s;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe88;
  NetRuntimeError *in_stack_fffffffffffffe90;
  undefined **ppuVar9;
  undefined **ppuVar10;
  char local_f9 [25];
  uint uVar11;
  int local_40;
  undefined1 local_3a;
  int local_18 [5];
  int local_4;
  
  if (glob < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
           ,0x2ad,"RmtSendMain",logDEBUG,"Sender thread started");
  }
  local_4 = 0;
  do {
    if (gpMc == (UDPMulticast *)0x0) {
      this = (XPMP2Error *)__cxa_allocate_exception(0x78);
      XPMP2Error::XPMP2Error
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
                 ,0x2b2,"RmtSendMain","ASSERT FAILED: %s","gpMc != nullptr");
      __cxa_throw(this,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
    }
    DAT_0047dd9c = 1;
    UDPMulticast::Join(in_stack_000003b0,in_stack_000003a8,in_stack_000003a4,in_stack_00000398,
                       in_stack_00000394,in_stack_00000388,in_stack_000003c0);
    SVar3 = SocketNetworking::getSocket(&gpMc->super_SocketNetworking);
    local_18[0] = SVar3 + 1;
    iVar4 = pipe(&gSelfPipe);
    if (iVar4 < 0) {
      local_3a = 1;
      uVar7 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      NetRuntimeError::NetRuntimeError
                (in_stack_fffffffffffffe90,(string *)CONCAT44(SVar3,in_stack_fffffffffffffe88));
      local_3a = 0;
      __cxa_throw(uVar7,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    fcntl(gSelfPipe,4,0x800);
    local_40 = gSelfPipe + 1;
    piVar8 = std::max<int>(local_18,&local_40);
    local_18[0] = *piVar8;
    if (glob < 2) {
      UDPMulticast::GetMCAddr_abi_cxx11_(gpMc);
      uVar7 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x2c5,"RmtSendMain",logINFO,
             "Listening to %s, waiting for someone being interested in our data...",uVar7);
    }
    do {
      do {
        bVar2 = RmtSendContinue();
        if (!bVar2) goto LAB_0035e456;
        for (uVar11 = 0; uVar11 < 0x10; uVar11 = uVar11 + 1) {
          *(undefined8 *)(&stack0xffffffffffffff40 + (ulong)uVar11 * 8) = 0;
        }
        SVar5 = SocketNetworking::getSocket(&gpMc->super_SocketNetworking);
        SVar6 = SocketNetworking::getSocket(&gpMc->super_SocketNetworking);
        if (SVar6 < 0) {
          SVar6 = SVar6 + 0x3f;
        }
        *(ulong *)(&stack0xffffffffffffff40 + (long)(SVar6 >> 6) * 8) =
             *(ulong *)(&stack0xffffffffffffff40 + (long)(SVar6 >> 6) * 8) |
             1L << ((byte)SVar5 & 0x3f);
        iVar4 = gSelfPipe;
        if (gSelfPipe < 0) {
          iVar4 = gSelfPipe + 0x3f;
        }
        *(ulong *)(&stack0xffffffffffffff40 + (long)(iVar4 >> 6) * 8) =
             *(ulong *)(&stack0xffffffffffffff40 + (long)(iVar4 >> 6) * 8) |
             1L << ((ulong)(byte)gSelfPipe & 0x3f);
        in_stack_fffffffffffffe44 =
             select(local_18[0],(fd_set *)&stack0xffffffffffffff40,(fd_set *)0x0,(fd_set *)0x0,
                    (timeval *)0x0);
        iVar4 = in_stack_fffffffffffffe44;
        bVar2 = RmtSendContinue();
        in_stack_fffffffffffffe40 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe40);
        if (!bVar2) goto LAB_0035e456;
        if (iVar4 == -1) {
          __a = (allocator<char> *)__cxa_allocate_exception(0x50);
          __s = local_f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),__s,__a);
          NetRuntimeError::NetRuntimeError
                    (in_stack_fffffffffffffe90,(string *)CONCAT44(SVar3,in_stack_fffffffffffffe88));
          __cxa_throw(__a,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
        }
      } while (iVar4 < 1);
      SVar6 = SocketNetworking::getSocket(&gpMc->super_SocketNetworking);
      if (SVar6 < 0) {
        SVar6 = SVar6 + 0x3f;
      }
      uVar1 = *(ulong *)(&stack0xffffffffffffff40 + (long)(SVar6 >> 6) * 8);
      SVar6 = SocketNetworking::getSocket(&gpMc->super_SocketNetworking);
    } while ((uVar1 & 1L << ((byte)((long)SVar6 % 0x40) & 0x3f)) == 0);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffee0);
    UDPMulticast::RecvMC
              (in_stack_00000380,(bool)in_stack_0000037f,in_stack_00000370,in_stack_00000368,
               in_stack_00000360);
    if (glob < 2) {
      uVar7 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x2e4,"RmtSendMain",logINFO,"Received word from %s, will start sending aircraft data",
             uVar7);
    }
    DAT_0047dd9c = 2;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
LAB_0035e456:
    ppuVar9 = &PTR_typeinfo_00470e18;
    piVar8 = &gSelfPipe;
    while ((undefined **)piVar8 != ppuVar9) {
      ppuVar10 = (undefined **)piVar8;
      if (*piVar8 != -1) {
        close(*piVar8);
      }
      *piVar8 = -1;
      piVar8 = (int *)((long)ppuVar10 + 4);
    }
    bVar2 = RmtSendContinue();
    if (bVar2) {
      RmtSendLoop();
    }
    if (gpMc != (UDPMulticast *)0x0) {
      (*(gpMc->super_SocketNetworking)._vptr_SocketNetworking[4])();
    }
    if (4 < local_4) {
      if (glob < 5) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x30a,"RmtSendMain",logFATAL,"Too many errors, I give up on remote functionality!");
      }
      gbRemoteGaveUp = 1;
    }
    if ((gbStopMCThread & 1) != 0 || 4 < local_4) {
      DAT_0047dd9c = 0;
      gbStopMCThread = 1;
      if (glob < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x313,"RmtSendMain",logDEBUG,"Sender thread stopping");
      }
      return;
    }
  } while( true );
}

Assistant:

void RmtSendMain()
{
    // This is a thread main function, set thread's name
    SET_THREAD_NAME("XPMP2_Send");
    LOG_MSG(logDEBUG, "Sender thread started");
    int cntMCErr = 0;                       ///< error counter for network thread
    
    do {
        try {
            LOG_ASSERT(gpMc != nullptr);
            
            // Set global status to: we are "waiting" for some action on the multicast group
            glob.remoteStatus = REMOTE_SEND_WAITING;
            
            // Create a multicast socket and listen if there is any traffic in our multicast group
            gpMc->Join(glob.remoteMCGroup, glob.remotePort, glob.remoteSendIntf,
                       glob.remoteTTL, glob.remoteBufSize);
            int maxSock = (int)gpMc->getSocket() + 1;
#if APL == 1 || LIN == 1
            // the self-pipe to shut down the TCP socket gracefully
            if (pipe(gSelfPipe) < 0)
                throw NetRuntimeError("Couldn't create self-pipe");
            fcntl(gSelfPipe[0], F_SETFL, O_NONBLOCK);
            maxSock = std::max(maxSock, gSelfPipe[0]+1);
#endif
            
            // *** Main listening loop ***
            
            LOG_MSG(logINFO, INFO_MC_SEND_WAIT, gpMc->GetMCAddr().c_str());
            
            while (RmtSendContinue())
            {
                // wait for some signal on either socket (multicast or self-pipe)
                fd_set sRead;
                FD_ZERO(&sRead);
                FD_SET(gpMc->getSocket(), &sRead);      // check our socket
#if APL == 1 || LIN == 1
                FD_SET(gSelfPipe[0], &sRead);        // check the self-pipe
#endif
                int retval = select(maxSock, &sRead, NULL, NULL, NULL);
                
                // short-cut if we are to shut down (return from 'select' due to closed socket)
                if (!RmtSendContinue())
                    break;
                
                // select call failed???
                if (retval == -1)
                    throw NetRuntimeError("'select' failed");
                
                // select successful - there is multicast data!
                if (retval > 0 && FD_ISSET(gpMc->getSocket(), &sRead))
                {
                    // We aren't actually interested in the data as such,
                    // the fact that there was _any_ traffic already means:
                    // there is someone out there interested in our data.
                    // We just read received multicast to clear out the buffers
                    // and switch the sending interface to the interface we received from.
                    std::string from;
                    gpMc->RecvMC(true, &from);
                    LOG_MSG(logINFO, INFO_MC_SEND_RCVD, from.c_str());
                    
                    // Set global status to: we are about to send data, also exits listening loop
                    glob.remoteStatus = REMOTE_SENDING;
                    break;
                }
            }
            
#if APL == 1 || LIN == 1
            // close the self-pipe sockets
            for (SOCKET &s: gSelfPipe) {
                if (s != INVALID_SOCKET) close(s);
                s = INVALID_SOCKET;
            }
#endif
            // Continue? Then send data!
            if (RmtSendContinue())
                RmtSendLoop();
        }
        catch (std::exception& e) {
            ++cntMCErr;
            LOG_MSG(logERR, ERR_MC_THREAD, e.what());
            
#if APL == 1 || LIN == 1
            // close the self-pipe sockets
            for (SOCKET &s: gSelfPipe) {
                if (s != INVALID_SOCKET) close(s);
                s = INVALID_SOCKET;
            }
#endif
        }
        
        // close the multicast socket
        if (gpMc)
            gpMc->Close();
        
        // Error count too high?
        if (cntMCErr >= MC_MAX_ERR) {
            LOG_MSG(logFATAL, ERR_MC_MAX);
            gbRemoteGaveUp = true;          // the SENDER gives up after too many errors
        }
    }
    while (!gbStopMCThread && cntMCErr < MC_MAX_ERR);
        
    // make sure the end of the thread is recognized and joined
    glob.remoteStatus = REMOTE_OFF;
    gbStopMCThread = true;
    LOG_MSG(logDEBUG, "Sender thread stopping");
}